

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O0

void __thiscall
sentencepiece::bpe::Trainer::ResetFreq(Trainer *this,int sid,int left,int right,Symbol *best)

{
  reference pvVar1;
  reference ppSVar2;
  Symbol *pSVar3;
  Symbol *symbol;
  Symbol *best_local;
  int right_local;
  int left_local;
  int sid_local;
  Trainer *this_local;
  
  if ((left != -1) && (right != -1)) {
    pvVar1 = std::
             vector<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>,_std::allocator<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>_>_>
             ::operator[](&this->symbols_,(long)sid);
    ppSVar2 = std::
              vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
              ::operator[](pvVar1,(long)left);
    pSVar3 = *ppSVar2;
    pvVar1 = std::
             vector<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>,_std::allocator<std::vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>_>_>
             ::operator[](&this->symbols_,(long)sid);
    ppSVar2 = std::
              vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
              ::operator[](pvVar1,(long)right);
    pSVar3 = GetPairSymbol(this,pSVar3,*ppSVar2);
    if ((pSVar3 != (Symbol *)0x0) && (pSVar3 != best)) {
      pSVar3->freq = 0;
    }
  }
  return;
}

Assistant:

void Trainer::ResetFreq(int sid, int left, int right, const Symbol *best) {
  if (left == -1 || right == -1) return;
  auto *symbol = GetPairSymbol(symbols_[sid][left], symbols_[sid][right]);
  if (symbol != nullptr && symbol != best) {
    symbol->freq = 0;
  }
}